

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

bool HelpRequested(ArgsManager *args)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined1 uVar7;
  bool bVar8;
  undefined1 uVar9;
  ArgsManager *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  ArgsManager *in_stack_ffffffffffffff10;
  allocator<char> *in_stack_ffffffffffffff28;
  ArgsManager *__a;
  char *in_stack_ffffffffffffff30;
  allocator<char> *__s;
  undefined6 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 uVar10;
  undefined1 in_stack_ffffffffffffff3f;
  allocator<char> local_8c;
  allocator<char> local_8b;
  allocator<char> local_8a;
  allocator<char> local_89 [129];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  bVar6 = false;
  bVar5 = false;
  bVar4 = false;
  bVar3 = false;
  bVar2 = false;
  bVar1 = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff3f,
                      CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
             in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  uVar7 = ArgsManager::IsArgSet
                    (in_stack_ffffffffffffff10,
                     (string *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  uVar10 = true;
  if (!(bool)uVar7) {
    __s = &local_8a;
    __a = in_RDI;
    std::allocator<char>::allocator();
    bVar6 = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar7,CONCAT16(uVar10,in_stack_ffffffffffffff38)),(char *)__s,
               (allocator<char> *)__a);
    bVar5 = true;
    bVar8 = ArgsManager::IsArgSet
                      (in_stack_ffffffffffffff10,
                       (string *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    uVar10 = true;
    if (!bVar8) {
      std::allocator<char>::allocator();
      bVar4 = true;
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar7,CONCAT16(uVar10,in_stack_ffffffffffffff38)),(char *)__s,
                 (allocator<char> *)__a);
      bVar3 = true;
      uVar9 = ArgsManager::IsArgSet
                        (in_RDI,(string *)
                                CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
      uVar10 = true;
      if (!(bool)uVar9) {
        std::allocator<char>::allocator();
        bVar2 = true;
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar7,CONCAT16(uVar10,in_stack_ffffffffffffff38)),(char *)__s,
                   (allocator<char> *)__a);
        bVar1 = true;
        uVar10 = ArgsManager::IsArgSet(in_RDI,(string *)CONCAT17(uVar9,in_stack_ffffffffffffff08));
      }
    }
  }
  if (bVar1) {
    std::__cxx11::string::~string(in_stack_fffffffffffffee8);
  }
  if (bVar2) {
    std::allocator<char>::~allocator(&local_8c);
  }
  if (bVar3) {
    std::__cxx11::string::~string(in_stack_fffffffffffffee8);
  }
  if (bVar4) {
    std::allocator<char>::~allocator(&local_8b);
  }
  if (bVar5) {
    std::__cxx11::string::~string(in_stack_fffffffffffffee8);
  }
  if (bVar6) {
    std::allocator<char>::~allocator(&local_8a);
  }
  std::__cxx11::string::~string(in_stack_fffffffffffffee8);
  std::allocator<char>::~allocator(local_89);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)uVar10;
}

Assistant:

bool HelpRequested(const ArgsManager& args)
{
    return args.IsArgSet("-?") || args.IsArgSet("-h") || args.IsArgSet("-help") || args.IsArgSet("-help-debug");
}